

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

int Acb_NtkFindDivs_rec(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  
  if ((iObj < 0) || ((p->vObjTrav).nSize <= iObj)) goto LAB_0036d5ff;
  piVar3 = (p->vObjTrav).pArray;
  iVar1 = piVar3[(uint)iObj];
  iVar2 = p->nObjTravs;
  uVar8 = 1;
  if (iVar1 != iVar2 + -1) {
    piVar3[(uint)iObj] = iVar2;
    uVar8 = 0;
    if (iVar1 != iVar2) {
      if (iObj == 0) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar8 = 0;
      if ((p->vObjType).pArray[(uint)iObj] != '\x03') {
        if ((p->vObjFans).nSize <= iObj) {
LAB_0036d5ff:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vObjFans).pArray[(uint)iObj];
        lVar7 = (long)iVar1;
        if ((lVar7 < 0) || ((p->vFanSto).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar3 = (p->vFanSto).pArray;
        if (piVar3[lVar7] < 1) {
          uVar8 = 1;
        }
        else {
          uVar8 = 1;
          lVar6 = 0;
          do {
            lVar4 = lVar6 + 1;
            lVar6 = lVar6 + 1;
            uVar5 = Acb_NtkFindDivs_rec(p,piVar3[lVar7 + lVar4]);
            uVar8 = uVar8 & uVar5;
          } while (lVar6 < piVar3[lVar7]);
        }
        if (uVar8 != 0) {
          if ((p->vObjTrav).nSize <= iObj) goto LAB_0036d5ff;
          (p->vObjTrav).pArray[(uint)iObj] = p->nObjTravs + -1;
        }
      }
    }
  }
  return uVar8;
}

Assistant:

int Acb_NtkFindDivs_rec( Acb_Ntk_t * p, int iObj )
{
    int * pFanin, iFanin, i, Res = 1;
    if ( Acb_ObjIsTravIdPrev(p, iObj) )
        return 1;
    if ( Acb_ObjSetTravIdCur(p, iObj) )  
        return 0;
    if ( Acb_ObjIsCi(p, iObj) )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
        Res &= Acb_NtkFindDivs_rec( p, iFanin );
    if ( Res ) Acb_ObjSetTravIdPrev( p, iObj );
    return Res;
}